

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O3

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,Def *def)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Type *pTVar3;
  ostream *poVar4;
  CompoundStatement *pCVar5;
  Class *pCVar6;
  int iVar7;
  string local_50;
  
  if (0 < this->n_spaces) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x20,"    ",4);
      iVar7 = iVar7 + 1;
    } while (iVar7 < this->n_spaces);
  }
  pTVar3 = Def::getReturnType(def);
  (**(pTVar3->super_ASTNode)._vptr_ASTNode)(pTVar3,this);
  puVar1 = &this->field_0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," ",1);
  Def::getUniqueCppName_abi_cxx11_(&local_50,def);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
  paVar2 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  generateDefParameters(this,def);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,") {\n",4);
  this->n_spaces = this->n_spaces + 1;
  generateDefLocalVariables(this,def);
  this->tmpCounter = 0;
  pCVar5 = Def::getStatements(def);
  (**(pCVar5->super_Statement).super_ASTNode._vptr_ASTNode)(pCVar5,this);
  iVar7 = this->n_spaces;
  this->n_spaces = iVar7 + -1;
  if (1 < iVar7) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"    ",4);
      iVar7 = iVar7 + 1;
    } while (iVar7 < this->n_spaces);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"}\n\n",3);
  Def::getName_abi_cxx11_(&local_50,def);
  iVar7 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar7 == 0) {
    pCVar6 = Def::getClass(def);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (pCVar6 == (Class *)0x0) {
      this->mainDef = def;
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CppPrinter::visit(Def* def) {
    print_indentation();
    def->getReturnType()->accept(this);
    output << " " << def->getUniqueCppName() << "(";

    generateDefParameters(def);
    output << ") {\n";

    indent();

    generateDefLocalVariables(def);

    tmpCounter = 0;
    def->getStatements()->accept(this);
    dedent();
    print_indentation();
    output << "}\n\n";

    if (def->getName().compare("main") == 0 && def->getClass() == nullptr) {
        mainDef = def;
    }
}